

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  RawSchema **ppRVar1;
  RawSchema *pRVar2;
  ChunkHeader *pCVar3;
  Dependency *pDVar4;
  size_t sVar5;
  bool bVar6;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar7;
  uint local_294;
  Maybe<capnp::SchemaLoader::Impl::RequiredSize_&> MStack_290;
  uint i_1;
  RequiredSize *local_288;
  RequiredSize *sizeReq;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_270;
  undefined1 local_258 [8];
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> deps;
  undefined1 auStack_240 [4];
  uint i;
  ArrayPtr<const_capnp::_::RawSchema_*> dependencies;
  RawSchema temp;
  CompatibilityChecker checker;
  Reader native;
  Reader existing;
  Reader local_d0;
  ArrayPtr<const_char> local_a0;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  RawSchema **match;
  bool shouldClearInitializer;
  Impl *pIStack_30;
  bool shouldReplace;
  RawSchema *schema;
  RawSchema *nativeSchema_local;
  Impl *this_local;
  
  f.exception = (Exception *)
                kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long_const&>
                          ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->schemas,
                           &nativeSchema->id);
  ppRVar1 = kj::_::readMaybe<capnp::_::RawSchema*>((Maybe<capnp::_::RawSchema_*&> *)&f);
  if (ppRVar1 == (RawSchema **)0x0) {
    pIStack_30 = (Impl *)kj::Arena::allocate<capnp::_::RawSchema>(&this->arena);
    memset((RawBrandedSchema *)
           &(pIStack_30->dedupTable).
            super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
            indexes.erasedCount,0,0x28);
    ((RawBrandedSchema *)
    &(pIStack_30->dedupTable).
     super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes
     .erasedCount)->generic = (RawSchema *)pIStack_30;
    *(Initializer **)
     &(pIStack_30->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes = (Initializer *)0x0;
    (pIStack_30->schemas).table.rows.builder.ptr = (Entry *)0x0;
    match._7_1_ = true;
    bVar6 = false;
    kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::insert
              (&this->schemas,nativeSchema->id,(RawSchema *)pIStack_30);
  }
  else {
    pIStack_30 = (Impl *)*ppRVar1;
    if ((RawSchema *)
        (pIStack_30->dedupTable).
        super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows
        .builder.disposer != (RawSchema *)0x0) {
      if ((RawSchema *)
          (pIStack_30->dedupTable).
          super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
          rows.builder.disposer == nativeSchema) {
        return (RawSchema *)pIStack_30;
      }
      readMessageUnchecked<capnp::schema::Node>(&local_90,nativeSchema->encodedNode);
      local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
      readMessageUnchecked<capnp::schema::Node>
                (&local_d0,
                 ((RawSchema *)
                 (pIStack_30->dedupTable).
                 super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 .rows.builder.disposer)->encodedNode);
      local_a0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_d0);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x52e,FAILED,"schema->canCastTo == nativeSchema",
                 "\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                 ,(char (*) [53])"two different compiled-in type have the same type ID",
                 &nativeSchema->id,(Reader *)&local_60,(Reader *)&local_a0);
      kj::_::Debug::Fault::fatal(&local_50);
    }
    readMessageUnchecked<capnp::schema::Node>
              ((Reader *)&native._reader.nestingLimit,(word *)(pIStack_30->arena).chunkList);
    readMessageUnchecked<capnp::schema::Node>
              ((Reader *)&checker.compatibility,nativeSchema->encodedNode);
    CompatibilityChecker::CompatibilityChecker
              ((CompatibilityChecker *)&temp.defaultBrand.lazyInitializer,this);
    match._7_1_ = CompatibilityChecker::shouldReplace
                            ((CompatibilityChecker *)&temp.defaultBrand.lazyInitializer,
                             (Reader *)&native._reader.nestingLimit,(Reader *)&checker.compatibility
                             ,true);
    bVar6 = *(Initializer **)
             &(pIStack_30->dedupTable).
              super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
              .indexes != (Initializer *)0x0;
  }
  if (match._7_1_ == false) {
    (pIStack_30->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.disposer = (ArrayDisposer *)nativeSchema;
    for (local_294 = 0; local_294 < nativeSchema->dependencyCount; local_294 = local_294 + 1) {
      loadNative(this,nativeSchema->dependencies[local_294]);
    }
  }
  else {
    memcpy(&dependencies.size_,nativeSchema,0x70);
    temp.canCastTo =
         *(RawSchema **)
          &(pIStack_30->dedupTable).
           super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
           indexes;
    memcpy(pIStack_30,&dependencies.size_,0x70);
    ((RawBrandedSchema *)
    &(pIStack_30->dedupTable).
     super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes
     .erasedCount)->generic = (RawSchema *)pIStack_30;
    (pIStack_30->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.rows.
    builder.disposer = (ArrayDisposer *)nativeSchema;
    _auStack_240 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                             (&this->arena,
                              (ulong)*(uint *)&(pIStack_30->dedupTable).
                                               super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                                               .rows.builder.pos);
    for (deps.size_._4_4_ = 0; deps.size_._4_4_ < nativeSchema->dependencyCount;
        deps.size_._4_4_ = deps.size_._4_4_ + 1) {
      pRVar2 = loadNative(this,nativeSchema->dependencies[deps.size_._4_4_]);
      ppRVar1 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::operator[]
                          ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_240,
                           (ulong)deps.size_._4_4_);
      *ppRVar1 = pRVar2;
    }
    pCVar3 = (ChunkHeader *)
             kj::ArrayPtr<const_capnp::_::RawSchema_*>::begin
                       ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_240);
    (pIStack_30->arena).currentChunk = pCVar3;
    kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>::ArrayPtr
              ((ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&sizeReq);
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::Maybe
              (&local_270,(ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> *)&sizeReq);
    AVar7 = makeBrandedDependencies(this,(RawSchema *)pIStack_30,&local_270);
    deps.ptr = (Dependency *)AVar7.size_;
    local_258 = (undefined1  [8])AVar7.ptr;
    kj::Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>::~Maybe(&local_270);
    pDVar4 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::begin
                       ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_258);
    (pIStack_30->dedupTable).
    super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.indexes.
    buckets.size_ = (size_t)pDVar4;
    sVar5 = kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency>::size
                      ((ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> *)local_258);
    *(uint32_t *)
     ((long)&(pIStack_30->dedupTable).
             super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
             .indexes.buckets.disposer + 4) = (uint32_t)sVar5;
    MStack_290 = kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::
                 find<unsigned_long_const&>
                           ((HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize> *)
                            &this->structSizeRequirements,&nativeSchema->id);
    local_288 = kj::_::readMaybe<capnp::SchemaLoader::Impl::RequiredSize>(&stack0xfffffffffffffd70);
    if (local_288 != (RequiredSize *)0x0) {
      applyStructSizeRequirement
                (this,(RawSchema *)pIStack_30,(uint)local_288->dataWordCount,
                 (uint)local_288->pointerCount);
    }
  }
  if (bVar6) {
    *(Initializer **)
     &(pIStack_30->dedupTable).
      super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>.
      indexes = (Initializer *)0x0;
    (pIStack_30->schemas).table.rows.builder.ptr = (Entry *)0x0;
  }
  return (RawSchema *)pIStack_30;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_MAYBE(match, schemas.find(nativeSchema->id)) {
    schema = *match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }